

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger_factory.cpp
# Opt level: O0

shared_ptr<spdlog::logger> __thiscall
bidfx_public_api::tools::LoggerFactory::GetLogger(LoggerFactory *this,string *log_id)

{
  bool bVar1;
  level_enum *plVar2;
  element_type *peVar3;
  pair<std::_Rb_tree_const_iterator<std::shared_ptr<spdlog::logger>_>,_bool> pVar4;
  shared_ptr<spdlog::logger> sVar5;
  __normal_iterator<std::shared_ptr<spdlog::sinks::sink>_*,_std::vector<std::shared_ptr<spdlog::sinks::sink>,_std::allocator<std::shared_ptr<spdlog::sinks::sink>_>_>_>
  local_28;
  undefined1 local_19;
  string *local_18;
  string *log_id_local;
  shared_ptr<spdlog::logger> *logger;
  
  local_19 = 0;
  local_18 = log_id;
  log_id_local = (string *)this;
  local_28._M_current =
       (shared_ptr<spdlog::sinks::sink> *)
       std::
       begin<std::vector<std::shared_ptr<spdlog::sinks::sink>,std::allocator<std::shared_ptr<spdlog::sinks::sink>>>>
                 ((vector<std::shared_ptr<spdlog::sinks::sink>,_std::allocator<std::shared_ptr<spdlog::sinks::sink>_>_>
                   *)sinks_);
  std::
  end<std::vector<std::shared_ptr<spdlog::sinks::sink>,std::allocator<std::shared_ptr<spdlog::sinks::sink>>>>
            ((vector<std::shared_ptr<spdlog::sinks::sink>,_std::allocator<std::shared_ptr<spdlog::sinks::sink>_>_>
              *)sinks_);
  std::
  make_shared<spdlog::logger,std::__cxx11::string&,__gnu_cxx::__normal_iterator<std::shared_ptr<spdlog::sinks::sink>*,std::vector<std::shared_ptr<spdlog::sinks::sink>,std::allocator<std::shared_ptr<spdlog::sinks::sink>>>>,__gnu_cxx::__normal_iterator<std::shared_ptr<spdlog::sinks::sink>*,std::vector<std::shared_ptr<spdlog::sinks::sink>,std::allocator<std::shared_ptr<spdlog::sinks::sink>>>>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
             (__normal_iterator<std::shared_ptr<spdlog::sinks::sink>_*,_std::vector<std::shared_ptr<spdlog::sinks::sink>,_std::allocator<std::shared_ptr<spdlog::sinks::sink>_>_>_>
              *)log_id,&local_28);
  bVar1 = std::optional::operator_cast_to_bool((optional *)&flush_severity_);
  if (bVar1) {
    peVar3 = std::__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    plVar2 = std::optional<spdlog::level::level_enum>::operator*
                       ((optional<spdlog::level::level_enum> *)&flush_severity_);
    spdlog::logger::flush_on(peVar3,*plVar2);
  }
  peVar3 = std::__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  spdlog::logger::set_level(peVar3,level_);
  pVar4 = std::
          set<std::shared_ptr<spdlog::logger>,_std::less<std::shared_ptr<spdlog::logger>_>,_std::allocator<std::shared_ptr<spdlog::logger>_>_>
          ::insert((set<std::shared_ptr<spdlog::logger>,_std::less<std::shared_ptr<spdlog::logger>_>,_std::allocator<std::shared_ptr<spdlog::logger>_>_>
                    *)loggers_,(value_type *)this);
  sVar5.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       pVar4._8_8_;
  sVar5.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (shared_ptr<spdlog::logger>)
         sVar5.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<spdlog::logger> LoggerFactory::GetLogger(std::string log_id)
{
    auto logger = std::make_shared<spdlog::logger>(log_id, begin(sinks_), end(sinks_));
    if (flush_severity_)
    {
        logger->flush_on(*flush_severity_);
    }
    logger->set_level(level_);
    loggers_.insert(logger);
    return logger;
}